

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.c
# Opt level: O0

int read_file(char *file,uint8_t **data,size_t *size)

{
  FILE *__stream;
  void *pvVar1;
  size_t *in_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  FILE *f;
  stat info;
  size_t tmp;
  stat local_b8;
  size_t local_28;
  size_t *local_20;
  undefined8 *local_18;
  char *local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  __stream = fopen(in_RDI,"rb");
  stat(local_10,&local_b8);
  pvVar1 = calloc(local_b8.st_size,1);
  *local_18 = pvVar1;
  local_28 = fread((void *)*local_18,1,local_b8.st_size,__stream);
  if (local_28 == local_b8.st_size) {
    fclose(__stream);
    *local_20 = local_b8.st_size;
    local_4 = 0;
  }
  else {
    free((void *)*local_18);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int read_file(const char *file, uint8_t **data, size_t *size)
{
	size_t tmp;
	struct stat info;
	FILE *f;

	f = fopen(file, "rb");
	stat(file, &info);
	*data = calloc(info.st_size, 1);
	tmp = fread(*data, 1, info.st_size, f);
	if (tmp != info.st_size) {
		free(*data);
		return -1;
	}

	fclose(f);
	*size = info.st_size;
	return 0;
}